

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recursive_descent_parser.cpp
# Opt level: O3

JsonValue * __thiscall MercuryJson::JSON::_parse_object(JSON *this)

{
  JsonObject *args;
  JsonObject *pJVar1;
  JsonValue *pJVar2;
  ulong index;
  runtime_error *this_00;
  ulong index_00;
  char cVar3;
  ulong uVar4;
  ulong *puVar5;
  char *pcVar6;
  ulong *puVar7;
  JsonObject *pJVar8;
  
  puVar7 = this->idx_ptr;
  pcVar6 = this->input;
  index_00 = *puVar7;
  cVar3 = pcVar6[index_00];
  if (cVar3 == '\"') {
    this->idx_ptr = puVar7 + 1;
    if (index_00 < this->input_len) {
      this->idx_ptr = puVar7 + 2;
      index = puVar7[1];
      if (index < this->input_len) {
        cVar3 = pcVar6[index];
        if (cVar3 != ':') {
LAB_0010ebd7:
          _error(this,"\':\'",cVar3,index);
        }
        pJVar2 = _parse_value(this);
        args = BlockAllocator<MercuryJson::JsonValue>::
               construct<MercuryJson::JsonObject,char*,MercuryJson::JsonValue*>
                         (&this->allocator,pcVar6 + index_00 + 1,pJVar2);
        puVar5 = this->idx_ptr;
        uVar4 = this->input_len;
        puVar7 = puVar5 + 1;
        this->idx_ptr = puVar7;
        index_00 = *puVar5;
        pJVar8 = args;
        if (index_00 < uVar4) {
          do {
            pcVar6 = this->input;
            cVar3 = pcVar6[index_00];
            if (cVar3 != ',') {
              if (cVar3 == '}') goto LAB_0010ebc9;
              pcVar6 = "\',\'";
              goto LAB_0010ec52;
            }
            index_00 = *puVar7;
            cVar3 = pcVar6[index_00];
            if (cVar3 != '\"') goto LAB_0010ebef;
            this->idx_ptr = puVar5 + 2;
            if (uVar4 <= index_00) {
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this_00,"text ended prematurely");
              goto LAB_0010ec32;
            }
            this->idx_ptr = puVar5 + 3;
            index = puVar5[2];
            if (uVar4 <= index) {
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this_00,"text ended prematurely");
              goto LAB_0010ec32;
            }
            cVar3 = pcVar6[index];
            if (cVar3 != ':') goto LAB_0010ebd7;
            pJVar2 = _parse_value(this);
            pJVar1 = BlockAllocator<MercuryJson::JsonValue>::
                     construct<MercuryJson::JsonObject,char*,MercuryJson::JsonValue*>
                               (&this->allocator,pcVar6 + index_00 + 1,pJVar2);
            pJVar8->next = pJVar1;
            puVar5 = this->idx_ptr;
            uVar4 = this->input_len;
            puVar7 = puVar5 + 1;
            this->idx_ptr = puVar7;
            index_00 = *puVar5;
            pJVar8 = pJVar1;
          } while (index_00 < uVar4);
        }
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"text ended prematurely");
      }
      else {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"text ended prematurely");
      }
    }
    else {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"text ended prematurely");
    }
  }
  else {
    if (cVar3 != '}') {
LAB_0010ebef:
      pcVar6 = "\'\"\'";
LAB_0010ec52:
      _error(this,pcVar6,cVar3,index_00);
    }
    this->idx_ptr = puVar7 + 1;
    if (index_00 < this->input_len) {
      args = (JsonObject *)0x0;
LAB_0010ebc9:
      pJVar2 = BlockAllocator<MercuryJson::JsonValue>::
               construct<MercuryJson::JsonValue,MercuryJson::JsonObject*>(&this->allocator,args);
      return pJVar2;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"text ended prematurely");
  }
LAB_0010ec32:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

JsonValue *JSON::_parse_object() {
        size_t idx;
        char ch;
        peek_char();
        if (ch == '}') {
            next_char();
            return allocator.construct(static_cast<JsonObject *>(nullptr));
        }

        expect('"');
        char *str = _parse_str(idx);
        next_char();
        next_char();
        expect(':');
        JsonValue *value = _parse_value();
        auto *object = allocator.construct<JsonObject>(str, value), *ptr = object;
        while (true) {
            next_char();
            if (ch == '}') break;
            expect(',');
            peek_char();
            expect('"');
            str = _parse_str(idx);
            next_char();
            next_char();
            expect(':');
            value = _parse_value();
            ptr = ptr->next = allocator.construct<JsonObject>(str, value);
        }
        return allocator.construct(object);
    }